

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<ot::commissioner::JoinerType>,testing::Matcher<unsigned_long>>,std::tuple<ot::commissioner::JoinerType,unsigned_long>>
               (tuple<testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_long>_>
                *matcher_tuple,tuple<ot::commissioner::JoinerType,_unsigned_long> *value_tuple)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined1 uVar3;
  int iVar4;
  DummyMatchResultListener dummy;
  
  peVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_long>_>
           ).super__Head_base<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_false>.
           _M_head_impl.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  iVar4 = (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (peVar1,&(value_tuple->
                             super__Tuple_impl<0UL,_ot::commissioner::JoinerType,_unsigned_long>).
                             super__Head_base<0UL,_ot::commissioner::JoinerType,_false>);
  if ((char)iVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    peVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_long>_>
             ).super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
             super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
             super_MatcherBase<unsigned_long>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_long_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar4 = (*(peVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (peVar2,value_tuple);
    uVar3 = (undefined1)iVar4;
  }
  return (bool)uVar3;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }